

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20240722::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
::find_or_prepare_insert_non_soo<std::pair<int,int>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20240722::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
          *this,pair<int,_int> *key)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  ushort uVar3;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  uint uVar7;
  size_t sVar8;
  ctrl_t *pcVar9;
  slot_type *psVar10;
  size_t sVar11;
  ushort uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  __m128i match;
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  undefined1 auVar19 [16];
  iterator iVar35;
  FindInfo FVar36;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_78;
  size_t local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
          ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                    *)this);
  if (bVar4) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xede,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, absl::hash_internal::Hash<std::pair<int, int>>, std::equal_to<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, bool>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, Hash = absl::hash_internal::Hash<std::pair<int, int>>, Eq = std::equal_to<std::pair<int, int>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>, K = std::pair<int, int>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
              *)this);
  sVar8 = hash_internal::MixingHashState::hash<std::pair<int,_int>,_0>(key);
  probe(&local_78,(CommonFields *)this,sVar8);
  pcVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
           ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                      *)this);
  auVar14 = ZEXT216(CONCAT11((char)sVar8,(char)sVar8) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar13 = auVar14._0_4_;
  local_48._4_4_ = uVar13;
  local_48._0_4_ = uVar13;
  local_48._8_4_ = uVar13;
  local_48._12_4_ = uVar13;
  local_60 = sVar8;
  do {
    pcVar2 = pcVar9 + local_78.offset_;
    auVar14[0] = -(local_48[0] == *pcVar2);
    auVar14[1] = -(local_48[1] == pcVar2[1]);
    auVar14[2] = -(local_48[2] == pcVar2[2]);
    auVar14[3] = -(local_48[3] == pcVar2[3]);
    auVar14[4] = -(local_48[4] == pcVar2[4]);
    auVar14[5] = -(local_48[5] == pcVar2[5]);
    auVar14[6] = -(local_48[6] == pcVar2[6]);
    auVar14[7] = -(local_48[7] == pcVar2[7]);
    auVar14[8] = -(local_48[8] == pcVar2[8]);
    auVar14[9] = -(local_48[9] == pcVar2[9]);
    auVar14[10] = -(local_48[10] == pcVar2[10]);
    auVar14[0xb] = -(local_48[0xb] == pcVar2[0xb]);
    auVar14[0xc] = -(local_48[0xc] == pcVar2[0xc]);
    auVar14[0xd] = -(local_48[0xd] == pcVar2[0xd]);
    auVar14[0xe] = -(local_48[0xe] == pcVar2[0xe]);
    auVar14[0xf] = -(local_48[0xf] == pcVar2[0xf]);
    cVar18 = *pcVar2;
    cVar20 = pcVar2[1];
    cVar21 = pcVar2[2];
    cVar22 = pcVar2[3];
    cVar23 = pcVar2[4];
    cVar24 = pcVar2[5];
    cVar25 = pcVar2[6];
    cVar26 = pcVar2[7];
    cVar27 = pcVar2[8];
    cVar28 = pcVar2[9];
    cVar29 = pcVar2[10];
    cVar30 = pcVar2[0xb];
    cVar31 = pcVar2[0xc];
    cVar32 = pcVar2[0xd];
    cVar33 = pcVar2[0xe];
    cVar34 = pcVar2[0xf];
    for (uVar12 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf; uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
      local_58 = cVar18;
      cStack_57 = cVar20;
      cStack_56 = cVar21;
      cStack_55 = cVar22;
      cStack_54 = cVar23;
      cStack_53 = cVar24;
      cStack_52 = cVar25;
      cStack_51 = cVar26;
      cStack_50 = cVar27;
      cStack_4f = cVar28;
      cStack_4e = cVar29;
      cStack_4d = cVar30;
      cStack_4c = cVar31;
      cStack_4b = cVar32;
      cStack_4a = cVar33;
      cStack_49 = cVar34;
      uVar6 = TrailingZeros<unsigned_short>(uVar12);
      psVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                              *)this);
      sVar8 = uVar6 + local_78.offset_ & local_78.mask_;
      iVar16 = -(uint)((*key).first == psVar10[sVar8].value.first.first);
      iVar17 = -(uint)((*key).second == psVar10[sVar8].value.first.second);
      auVar15._4_4_ = iVar16;
      auVar15._0_4_ = iVar16;
      auVar15._8_4_ = iVar17;
      auVar15._12_4_ = iVar17;
      iVar16 = movmskpd((int)psVar10,auVar15);
      if (iVar16 == 3) {
        bVar4 = false;
        goto LAB_002e355b;
      }
      cVar18 = local_58;
      cVar20 = cStack_57;
      cVar21 = cStack_56;
      cVar22 = cStack_55;
      cVar23 = cStack_54;
      cVar24 = cStack_53;
      cVar25 = cStack_52;
      cVar26 = cStack_51;
      cVar27 = cStack_50;
      cVar28 = cStack_4f;
      cVar29 = cStack_4e;
      cVar30 = cStack_4d;
      cVar31 = cStack_4c;
      cVar32 = cStack_4b;
      cVar33 = cStack_4a;
      cVar34 = cStack_49;
    }
    auVar19[0] = -(cVar18 == kEmpty);
    auVar19[1] = -(cVar20 == kEmpty);
    auVar19[2] = -(cVar21 == kEmpty);
    auVar19[3] = -(cVar22 == kEmpty);
    auVar19[4] = -(cVar23 == kEmpty);
    auVar19[5] = -(cVar24 == kEmpty);
    auVar19[6] = -(cVar25 == kEmpty);
    auVar19[7] = -(cVar26 == kEmpty);
    auVar19[8] = -(cVar27 == kEmpty);
    auVar19[9] = -(cVar28 == kEmpty);
    auVar19[10] = -(cVar29 == kEmpty);
    auVar19[0xb] = -(cVar30 == kEmpty);
    auVar19[0xc] = -(cVar31 == kEmpty);
    auVar19[0xd] = -(cVar32 == kEmpty);
    auVar19[0xe] = -(cVar33 == kEmpty);
    auVar19[0xf] = -(cVar34 == kEmpty);
    uVar12 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar12 != 0) {
      sVar11 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
               ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                           *)this);
      pcVar9 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
               ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                          *)this);
      sVar8 = local_60;
      cVar5 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (sVar11,local_60,pcVar9);
      if (cVar5 == '\0') {
        uVar7 = TrailingZeros<unsigned_short>(uVar12);
      }
      else {
        uVar3 = 0xf;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar7 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      FVar36.offset = uVar7 + local_78.offset_ & local_78.mask_;
      FVar36.probe_length = local_78.index_;
      sVar8 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                        ((CommonFields *)this,sVar8,FVar36,
                         (PolicyFunctions *)GetPolicyFunctions()::value);
      bVar4 = true;
LAB_002e355b:
      iVar35 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                              *)this,sVar8);
      __return_storage_ptr__->first = iVar35;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    uVar1 = local_78.index_ + 0x10;
    local_78.offset_ = local_78.index_ + local_78.offset_ + 0x10 & local_78.mask_;
    local_78.index_ = uVar1;
    sVar8 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
            ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                        *)this);
    if (sVar8 < uVar1) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, absl::hash_internal::Hash<std::pair<int, int>>, std::equal_to<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, bool>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>, Hash = absl::hash_internal::Hash<std::pair<int, int>>, Eq = std::equal_to<std::pair<int, int>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>, K = std::pair<int, int>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }